

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::If(w3Interp *this)

{
  reference pvVar1;
  undefined1 local_48 [8];
  w3StackValue stack_value;
  uint32_t condition;
  w3Interp *this_local;
  
  stack_value.label.continuation._4_4_ = w3Stack::pop_u32(&this->super_w3Stack);
  w3StackValue::w3StackValue((w3StackValue *)local_48,Tag_Label);
  stack_value.frame = (w3Frame *)w3DecodedInstruction::Arity((this->super_Wasm).instr);
  stack_value.label.arity =
       (((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.field_8.if_end;
  w3Stack::push_label(&this->super_w3Stack,(w3StackValue *)local_48);
  if (stack_value.label.continuation._4_4_ == 0) {
    pvVar1 = std::vector<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>::operator[]
                       (&this->frame->code->decoded_instructions,
                        (((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u64
                       );
    (this->super_Wasm).instr = pvVar1 + -1;
  }
  return;
}

Assistant:

INTERP (If)
{
     __debugbreak ();

    const uint32_t condition = pop_u32 ();

    // Push the same label either way.
    w3StackValue stack_value (Tag_Label);
    stack_value.label.arity = instr->Arity ();
    stack_value.label.continuation = instr->if_end;
    push_label (stack_value);

    // If condition is false, skip ahead, to just past the Else.
    // The Else actually marks the end of If, more than the start of Else.
    if (!condition)
    {
        // Branch to one before target, because interpreter loop will increment.
        instr = &frame->code->decoded_instructions [instr->if_false] - 1;
    }
}